

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O1

int simplify_cond_branch(dmr_C *C,instruction *br,pseudo_t cond,instruction *def,pseudo_t *pp)

{
  anon_struct_16_3_b3cb483e_for_anon_union_24_12_0e8c74c2_for_instruction_7_20 aVar1;
  pseudo_t ppVar2;
  pseudo_type in_EAX;
  pseudo_type extraout_EAX;
  undefined8 *ptr;
  void **ppvVar3;
  instruction *piVar4;
  pseudo_t extraout_RDX;
  pseudo_t entry;
  anon_union_8_2_14638a90_for_instruction_5 *list;
  anon_struct_16_2_cb6bab4e_for_anon_union_24_12_0e8c74c2_for_instruction_7_2 aVar5;
  
  ppVar2 = *pp;
  list = &br->field_5;
  (br->field_5).target = ppVar2;
  piVar4 = def;
  entry = cond;
  if (ppVar2 != (pseudo_t)0x0) {
    in_EAX = ppVar2->type;
    if ((in_EAX != PSEUDO_VOID) && (in_EAX != PSEUDO_VAL)) {
      ptr = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
      ptr[1] = list;
      *ptr = br;
      piVar4 = (instruction *)list;
      ppvVar3 = ptrlist_add((ptr_list **)&ppVar2->users,ptr,&C->ptrlist_allocator);
      in_EAX = (pseudo_type)ppvVar3;
      entry = extraout_RDX;
    }
  }
  if (((cond != (pseudo_t)0x0) && (in_EAX = cond->type, in_EAX != PSEUDO_VOID)) &&
     (in_EAX != PSEUDO_VAL)) {
    in_EAX = delete_pseudo_user_list_entry
                       ((dmr_C *)&cond->users,(pseudo_user_list **)&list->target,(pseudo_t *)entry,
                        (int)piVar4);
    if (cond->users == (pseudo_user_list *)0x0) {
      dmrC_kill_insn(C,(cond->field_5).def,0);
      in_EAX = extraout_EAX;
    }
  }
  if (*(char *)def == '\x19') {
    aVar1 = (br->field_6).field_10;
    aVar5.bb_true = aVar1.context_expr;
    aVar5.bb_false._0_4_ = aVar1.increment;
    aVar5.bb_false._4_4_ = aVar1.check;
    (br->field_6).field_1 = aVar5;
  }
  return in_EAX;
}

Assistant:

static int simplify_cond_branch(struct dmr_C *C, struct instruction *br, pseudo_t cond, struct instruction *def, pseudo_t *pp)
{
	dmrC_use_pseudo(C, br, *pp, &br->cond);
	remove_usage(C, cond, &br->cond);
	if (def->opcode == OP_SET_EQ) {
		struct basic_block *true = br->bb_true;
		struct basic_block *false = br->bb_false;
		br->bb_false = true;
		br->bb_true = false;
	}
	return REPEAT_CSE;
}